

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

int slider_check_range(t_slider *x,int v)

{
  int iVar1;
  double dVar2;
  int local_14;
  int v_local;
  t_slider *x_local;
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  local_14 = v;
  if (SBORROW4(v,iVar1 * 2) != v + iVar1 * -2 < 0) {
    local_14 = ((x->x_gui).x_glist)->gl_zoom << 1;
  }
  if (local_14 * 100 + -100 < x->x_val) {
    x->x_val = local_14 * 100 + -100;
  }
  if (x->x_lin0_log1 == 0) {
    x->x_k = (x->x_max - x->x_min) / (double)(local_14 / ((x->x_gui).x_glist)->gl_zoom + -1);
  }
  else {
    dVar2 = log(x->x_max / x->x_min);
    x->x_k = dVar2 / (double)(local_14 / ((x->x_gui).x_glist)->gl_zoom + -1);
  }
  return local_14;
}

Assistant:

static int slider_check_range(t_slider *x, int v)
{
    if(v < IEM_SL_MINSIZE * IEMGUI_ZOOM(x))
        v = IEM_SL_MINSIZE * IEMGUI_ZOOM(x);
    if(x->x_val > (v * 100 - 100))
    {
        x->x_val = v * 100 - 100;
    }
    if(x->x_lin0_log1)
        x->x_k = log(x->x_max / x->x_min) / (double)(v/IEMGUI_ZOOM(x) - 1);
    else
        x->x_k = (x->x_max - x->x_min) / (double)(v/IEMGUI_ZOOM(x) - 1);

    return v;
}